

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

parser_node * amrex::parser_newf3(parser_f3_t ftype,parser_node *n1,parser_node *n2,parser_node *n3)

{
  parser_node *ppVar1;
  parser_nvp in_RCX;
  parser_node *in_RDX;
  parser_node *in_RSI;
  int in_EDI;
  parser_f3 *tmp;
  
  ppVar1 = (parser_node *)malloc(0x28);
  ppVar1->type = PARSER_F3;
  ppVar1->l = in_RSI;
  ppVar1->r = in_RDX;
  ppVar1->lvp = in_RCX;
  ppVar1->rip = in_EDI;
  return ppVar1;
}

Assistant:

struct parser_node*
parser_newf3 (enum parser_f3_t ftype, struct parser_node* n1, struct parser_node* n2,
              struct parser_node* n3)
{
    auto tmp = (struct parser_f3*) std::malloc(sizeof(struct parser_f3));
    tmp->type = PARSER_F3;
    tmp->n1 = n1;
    tmp->n2 = n2;
    tmp->n3 = n3;
    tmp->ftype = ftype;
    return (struct parser_node*) tmp;
}